

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto
          (DescriptorProto *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  DescriptorProto *this_local;
  
  Message::Message(&this->super_Message,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_008ea9b0;
  internal::HasBits<1UL>::HasBits(&this->_has_bits_);
  internal::CachedSize::CachedSize(&this->_cached_size_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField(&this->field_,arena);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField(&this->nested_type_,arena);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField(&this->enum_type_,arena)
  ;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::RepeatedPtrField
            (&this->extension_range_,arena);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->extension_,arena);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::RepeatedPtrField
            (&this->oneof_decl_,arena);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::RepeatedPtrField
            (&this->reserved_range_,arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->reserved_name_,arena);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

DescriptorProto::DescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  field_(arena),
  nested_type_(arena),
  enum_type_(arena),
  extension_range_(arena),
  extension_(arena),
  oneof_decl_(arena),
  reserved_range_(arena),
  reserved_name_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.DescriptorProto)
}